

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O3

void __thiscall aalcalc::do_calc_end(aalcalc *this,int period_no)

{
  _Rb_tree_header *p_Var1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  int iVar5;
  _Rb_tree_color _Var6;
  int iVar7;
  size_t sVar8;
  pointer paVar9;
  pointer paVar10;
  pointer pdVar11;
  pointer piVar12;
  pointer piVar13;
  pointer paVar14;
  pointer pdVar15;
  bool bVar16;
  _Rb_tree_color _Var17;
  _Self __tmp;
  _Base_ptr p_Var18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  _Rb_tree_node_base *p_Var21;
  _Base_ptr p_Var22;
  int *piVar23;
  int iVar24;
  int iVar25;
  _Rb_tree_color _Var26;
  _Rb_tree_color _Var27;
  long lVar28;
  int iVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  int local_9c;
  double local_98;
  double dStack_90;
  pointer local_88;
  ulong local_80;
  pointer local_78;
  pointer local_70;
  pointer local_68;
  long local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  sVar8 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_9c = period_no;
  if (sVar8 == 0) {
    local_58 = 1.0;
    dStack_40 = 0.0;
  }
  else {
    p_Var18 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_58 = 0.0;
    dStack_40 = 0.0;
    if (p_Var18 != (_Base_ptr)0x0) {
      auVar30._8_4_ = (int)(sVar8 >> 0x20);
      auVar30._0_8_ = sVar8;
      auVar30._12_4_ = 0x45300000;
      dVar31 = auVar30._8_8_ - 1.9342813113834067e+25;
      p_Var1 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
      p_Var22 = &p_Var1->_M_header;
      do {
        if (period_no <= (int)p_Var18[1]._M_color) {
          p_Var22 = p_Var18;
        }
        p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < period_no];
      } while (p_Var18 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var22 != p_Var1) && ((int)p_Var22[1]._M_color <= period_no)) {
        local_98 = dVar31 + ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0);
        dStack_90 = dVar31;
        pmVar19 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[](&this->periodstoweighting_,&local_9c);
        local_58 = local_98 * *pmVar19;
        dStack_40 = dStack_90;
      }
    }
  }
  paVar9 = (this->vec_analytical_aal_).super__Vector_base<aal_rec,_std::allocator<aal_rec>_>._M_impl
           .super__Vector_impl_data._M_start;
  dVar31 = *(this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  iVar5 = this->current_summary_id_;
  paVar9[iVar5].type = 1;
  paVar9[iVar5].summary_id = iVar5;
  dVar34 = (&paVar9[iVar5].mean)[1];
  paVar9[iVar5].mean = dVar31 * local_58 + paVar9[iVar5].mean;
  (&paVar9[iVar5].mean)[1] = dVar31 * dVar31 * local_58 + dVar34;
  dStack_50 = local_58;
  local_48 = local_58;
  pmVar20 = std::
            map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
            ::operator[](&this->vec_sample_aal_,&this->samplesize_);
  iVar5 = this->current_summary_id_;
  paVar10 = (pmVar20->super__Vector_base<aal_rec_period,_std::allocator<aal_rec_period>_>)._M_impl.
            super__Vector_impl_data._M_start;
  paVar10[iVar5].super_aal_rec.type = 2;
  _Var6 = this->samplesize_;
  iVar7 = this->current_summary_id_;
  iVar24 = iVar7;
  if (_Var6 == _S_red) {
    iVar24 = 0;
  }
  paVar10[iVar5].super_aal_rec.summary_id = iVar24;
  if ((int)_Var6 < 1) {
    dVar31 = 0.0;
  }
  else {
    local_68 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
    p_Var21 = (this->vec_sample_aal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_70 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_78 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_80 = (ulong)(uint)(this->max_ensemble_id_ * (iVar7 + -1));
    local_88 = (this->vec_ensemble_aal_).
               super__Vector_base<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>._M_impl.
               super__Vector_impl_data._M_start;
    dVar31 = 0.0;
    dVar37 = 0.0;
    local_60 = (long)iVar7 << 5;
    dVar34 = local_48;
    dVar35 = local_58;
    dVar36 = dStack_50;
    _Var27 = _S_black;
    do {
      _Var26 = p_Var21[1]._M_color;
      if (_Var26 != _Var6) {
        pdVar11 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        piVar12 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar13 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_98 = dVar31;
        dStack_90 = dVar37;
        do {
          piVar23 = (int *)((long)&(p_Var21[1]._M_parent)->_M_color + local_60);
          _Var17 = _Var26 * 2;
          dVar31 = 0.0;
          _Var27 = _Var26;
          if (SBORROW4(_Var26,_Var17) != 0 < (int)_Var26) {
            iVar24 = this->max_ensemble_id_;
            paVar14 = (this->vec_ensemble_aal_).
                      super__Vector_base<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            lVar28 = (long)(int)_Var26;
            do {
              dVar37 = pdVar11[lVar28];
              piVar23[1] = 2;
              *piVar23 = iVar7;
              dVar32 = dVar37 * dVar35;
              dVar33 = dVar37 * dVar37 * dVar36;
              *(double *)(piVar23 + 2) = *(double *)(piVar23 + 2) + dVar32;
              *(double *)(piVar23 + 4) = *(double *)(piVar23 + 4) + dVar33;
              dVar4 = paVar10[iVar5].super_aal_rec.mean_squared;
              paVar10[iVar5].super_aal_rec.mean = paVar10[iVar5].super_aal_rec.mean + dVar32;
              paVar10[iVar5].super_aal_rec.mean_squared = dVar4 + dVar33;
              if (piVar13 != piVar12) {
                iVar25 = piVar12[lVar28];
                iVar29 = iVar24 * (iVar7 + -1) + iVar25;
                paVar14[iVar29].super_aal_rec.summary_id = iVar7;
                paVar14[iVar29].super_aal_rec.type = 2;
                paVar14[iVar29].ensemble_id = iVar25;
                pdVar2 = &paVar14[iVar29].super_aal_rec.mean;
                dVar4 = pdVar2[1];
                pdVar3 = &paVar14[iVar29].super_aal_rec.mean;
                *pdVar3 = dVar32 + *pdVar2;
                pdVar3[1] = dVar33 + dVar4;
              }
              dVar31 = dVar31 + dVar37 * dVar34;
              local_98 = local_98 + dVar37 * dVar34;
              lVar28 = lVar28 + 1;
              _Var27 = _Var17;
            } while ((int)_Var17 != lVar28);
          }
          *(double *)(piVar23 + 6) = dVar31 * dVar31 + *(double *)(piVar23 + 6);
          p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
          _Var26 = p_Var21[1]._M_color;
          dVar34 = local_48;
          dVar35 = local_58;
          dVar36 = dStack_50;
          dVar31 = local_98;
          dVar37 = dStack_90;
        } while (_Var26 != _Var6);
      }
      dVar4 = local_68[(int)_Var27];
      dVar32 = paVar10[iVar5].super_aal_rec.mean_squared;
      dVar33 = dVar4 * dVar4 * dVar36;
      paVar10[iVar5].super_aal_rec.mean = paVar10[iVar5].super_aal_rec.mean + dVar4 * dVar35;
      paVar10[iVar5].super_aal_rec.mean_squared = dVar32 + dVar33;
      if (local_70 != local_78) {
        iVar24 = local_78[(int)_Var27];
        iVar25 = (int)local_80 + iVar24;
        local_88[iVar25].super_aal_rec.summary_id = iVar7;
        local_88[iVar25].super_aal_rec.type = 2;
        local_88[iVar25].ensemble_id = iVar24;
        pdVar2 = &local_88[iVar25].super_aal_rec.mean;
        dVar32 = pdVar2[1];
        pdVar3 = &local_88[iVar25].super_aal_rec.mean;
        *pdVar3 = dVar4 * dVar35 + *pdVar2;
        pdVar3[1] = dVar33 + dVar32;
      }
      dVar31 = dVar31 + dVar4 * dVar34;
      bVar16 = (int)_Var27 < (int)_Var6;
      _Var27 = _Var27 + _S_black;
    } while (bVar16);
  }
  paVar10[iVar5].mean_period = dVar31 * dVar31 + paVar10[iVar5].mean_period;
  pdVar11 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  pdVar15 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (pdVar11 != pdVar15) {
    memset(pdVar11,0,((long)pdVar15 + (-8 - (long)pdVar11) & 0xfffffffffffffff8U) + 8);
  }
  return;
}

Assistant:

void aalcalc::do_calc_end(const int period_no) {

	// Get weighting
	double weighting = 1;
	double factor = (double)periodstoweighting_.size();
	if (factor > 0) {
		if (periodstoweighting_.find(period_no) != periodstoweighting_.end()) {
			weighting = periodstoweighting_[period_no] * factor;
		} else {
			weighting = 0;
		}
	}

	// There is always an analytical mean
	double mean = vec_sample_sum_loss_[0];
	aal_rec& aa = vec_analytical_aal_[current_summary_id_];
	aa.type = 1;
	aa.summary_id = current_summary_id_;
	aa.mean += mean * weighting;
	aa.mean_squared += mean * mean * weighting;

	aal_rec_period& a_total = vec_sample_aal_[samplesize_][current_summary_id_];
	a_total.type = 2;
	a_total.summary_id = samplesize_ != 0 ? current_summary_id_ : 0;
	double total_mean_by_period = 0;
	auto iter = vec_sample_aal_.begin();
	for (int sidx = 1; sidx < samplesize_ + 1; sidx++) {
		while (iter->first != samplesize_) {
			aal_rec_period& a = iter->second[current_summary_id_];
			double mean_by_period = 0;
			for (sidx = iter->first; sidx < (iter->first << 1); sidx++)
			{
				mean = vec_sample_sum_loss_[sidx];
				a.type = 2;
				a.summary_id = current_summary_id_;
				mean_by_period += mean * weighting;
				a.mean += mean * weighting;
				total_mean_by_period += mean * weighting;
				a_total.mean += mean * weighting;
				a.mean_squared += mean * mean * weighting;
				a_total.mean_squared += mean * mean * weighting;
				if (sidxtoensemble_.size() > 0)
					fillensemblerec(sidx, mean, weighting);
			}
			a.mean_period += mean_by_period * mean_by_period;
			iter++;
		}
		mean = vec_sample_sum_loss_[sidx];
		total_mean_by_period += mean * weighting;
		a_total.mean += mean * weighting;
		a_total.mean_squared += mean * mean * weighting;
		if (sidxtoensemble_.size() > 0)
			fillensemblerec(sidx, mean, weighting);
	}
	a_total.mean_period += total_mean_by_period * total_mean_by_period;

	std::fill(vec_sample_sum_loss_.begin(), vec_sample_sum_loss_.end(), 0.0);

}